

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTrajectory.cpp
# Opt level: O1

void __thiscall chrono::ChLinkTrajectory::ArchiveIN(ChLinkTrajectory *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChLinkTrajectory>(marchive);
  ChLinkLockLock::ArchiveIN(&this->super_ChLinkLockLock,marchive);
  local_38._value = &this->space_fx;
  local_38._name = "space_fx";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->trajectory_line;
  local_38._name = "trajectory_line";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::geometry::ChLine>
            (marchive,(ChNameValue<std::shared_ptr<chrono::geometry::ChLine>_> *)&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->modulo_s;
  local_38._name = "modulo_s";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  return;
}

Assistant:

void ChLinkTrajectory::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkTrajectory>();

    // deserialize parent class
    ChLinkLockLock::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(space_fx);
    marchive >> CHNVP(trajectory_line);
    marchive >> CHNVP(modulo_s);
}